

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O1

void nukedopl3_update(void *chip,UINT32 samples,DEV_SMPL **out)

{
  uint uVar1;
  int iVar2;
  ulong uVar4;
  int32_t samples_1 [4];
  int local_48;
  int local_44;
  ulong uVar3;
  
  uVar3 = (ulong)samples;
  if (*(char *)((long)chip + 0x119b) == '\0') {
    if (samples != 0) {
      uVar4 = 0;
      do {
        NOPL3_Generate4ChResampled((opl3_chip *)chip,&local_48);
        (*out)[uVar4] = local_48 * *(int *)((long)chip + 0x11ec) >> 0xc;
        out[1][uVar4] = local_44 * *(int *)((long)chip + 0x11f0) >> 0xc;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  else {
    memset(*out,0,uVar3 << 2);
    memset(out[1],0,uVar3 << 2);
    if (*(int *)((long)chip + 0x11c0) == 0x400) {
      if (samples != 0) {
        do {
          if ((*(byte *)((long)chip + (ulong)*(uint *)((long)chip + 0x1200) * 0x10 + 0x1219) & 2) ==
              0) {
            return;
          }
          NOPL3_Generate4Ch((opl3_chip *)chip,(int32_t *)((long)chip + 0x11d8));
          uVar1 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar1;
        } while (uVar1 != 0);
      }
    }
    else {
      iVar2 = samples * 0x400 + *(int *)((long)chip + 0x11c4);
      *(int *)((long)chip + 0x11c4) = iVar2;
      if (*(int *)((long)chip + 0x11c0) <= iVar2) {
        do {
          if ((*(byte *)((long)chip + (ulong)*(uint *)((long)chip + 0x1200) * 0x10 + 0x1219) & 2) ==
              0) {
            *(undefined4 *)((long)chip + 0x11c4) = 0;
            return;
          }
          NOPL3_Generate4Ch((opl3_chip *)chip,(int32_t *)((long)chip + 0x11d8));
          iVar2 = *(int *)((long)chip + 0x11c4) - *(int *)((long)chip + 0x11c0);
          *(int *)((long)chip + 0x11c4) = iVar2;
        } while (*(int *)((long)chip + 0x11c0) <= iVar2);
      }
    }
  }
  return;
}

Assistant:

void nukedopl3_update(void *chip, UINT32 samples, DEV_SMPL **out)
{
	opl3_chip* opl3 = (opl3_chip*)chip;
	int32_t buffers[2];
	UINT32 i;

	if (opl3->isDisabled)
	{
		// Speed hack for possibly unused FM-part of OPL4 chip
		memset(out[0], 0, samples * sizeof(DEV_SMPL));
		memset(out[1], 0, samples * sizeof(DEV_SMPL));
#ifdef NOPL_ENABLE_WRITEBUF
		// make sure that the enqueued register writes get processed properly
		if (opl3->rateratio == (1 << RSM_FRAC))
		{
			for( i=0; i < samples ; i++ )
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
					break;
				NOPL3_Generate4Ch(opl3, opl3->samples);
			}
		}
		else
		{
			opl3->samplecnt += samples << RSM_FRAC;
			while(opl3->samplecnt >= opl3->rateratio)
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
				{
					opl3->samplecnt = 0;
					break;
				}
				NOPL3_Generate4Ch(opl3, opl3->samples);
				opl3->samplecnt -= opl3->rateratio;
			}
		}
#endif
		return;
	}

	for( i=0; i < samples ; i++ )
	{
		NOPL3_GenerateResampled(opl3, buffers);
		out[0][i] = (buffers[0] * opl3->masterVolL) >> 12;
		out[1][i] = (buffers[1] * opl3->masterVolR) >> 12;
	}
}